

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

int av1_encode(AV1_COMP *cpi,uint8_t *dest,size_t dest_size,EncodeFrameInput *frame_input,
              EncodeFrameParams *frame_params,size_t *frame_size)

{
  uint uVar1;
  int iVar2;
  undefined8 *in_RCX;
  AV1_COMP *in_RDI;
  int *in_R8;
  CurrentFrame *current_frame;
  AV1_COMMON *cm;
  int64_t in_stack_00000058;
  AV1_COMP *in_stack_00000060;
  size_t in_stack_000000f0;
  uint8_t *in_stack_000000f8;
  size_t *in_stack_00000100;
  AV1_COMP *in_stack_00000108;
  int64_t in_stack_00000168;
  AV1_COMP *in_stack_00000170;
  
  in_RDI->unscaled_source = (YV12_BUFFER_CONFIG *)*in_RCX;
  in_RDI->source = (YV12_BUFFER_CONFIG *)*in_RCX;
  in_RDI->unscaled_last_source = (YV12_BUFFER_CONFIG *)in_RCX[1];
  (in_RDI->common).current_frame.refresh_frame_flags = in_R8[5];
  (in_RDI->common).features.error_resilient_mode = *in_R8 != 0;
  (in_RDI->common).features.primary_ref_frame = in_R8[2];
  (in_RDI->common).current_frame.frame_type = (FRAME_TYPE)in_R8[1];
  (in_RDI->common).show_frame = in_R8[4];
  in_RDI->ref_frame_flags = in_R8[8];
  in_RDI->speed = in_R8[0x12];
  (in_RDI->common).show_existing_frame = in_R8[6];
  in_RDI->existing_fb_idx_to_show = in_R8[7];
  *(undefined8 *)(in_RDI->common).remapped_ref_idx = *(undefined8 *)(in_R8 + 9);
  *(undefined8 *)((in_RDI->common).remapped_ref_idx + 2) = *(undefined8 *)(in_R8 + 0xb);
  *(undefined8 *)((in_RDI->common).remapped_ref_idx + 4) = *(undefined8 *)(in_R8 + 0xd);
  *(undefined8 *)((in_RDI->common).remapped_ref_idx + 6) = *(undefined8 *)(in_R8 + 0xf);
  iVar2 = in_R8[0x11];
  (in_RDI->refresh_frame).golden_frame = (_Bool)(char)(short)iVar2;
  (in_RDI->refresh_frame).bwd_ref_frame = (_Bool)(char)((ushort)(short)iVar2 >> 8);
  (in_RDI->refresh_frame).alt_ref_frame = *(_Bool *)((long)in_R8 + 0x46);
  if (((in_RDI->common).current_frame.frame_type == '\0') &&
     ((in_RDI->ppi->gf_group).refbuf_state[in_RDI->gf_frame_index] == '\0')) {
    (in_RDI->common).current_frame.frame_number = 0;
  }
  (in_RDI->common).current_frame.order_hint = (in_RDI->common).current_frame.frame_number + in_R8[3]
  ;
  (in_RDI->common).current_frame.display_order_hint = (in_RDI->common).current_frame.order_hint;
  (in_RDI->common).current_frame.order_hint =
       (in_RDI->common).current_frame.order_hint %
       (uint)(1 << ((char)(((in_RDI->common).seq_params)->order_hint_info).order_hint_bits_minus_1 +
                    1U & 0x1f));
  uVar1 = get_true_pyr_level((in_RDI->ppi->gf_group).layer_depth[in_RDI->gf_frame_index],
                             (in_RDI->common).current_frame.display_order_hint,
                             (in_RDI->ppi->gf_group).max_layer_depth);
  (in_RDI->common).current_frame.pyramid_level = uVar1;
  iVar2 = is_stat_generation_stage(in_RDI);
  if (iVar2 == 0) {
    if (((in_RDI->oxcf).pass != AOM_RC_ONE_PASS) && ((in_RDI->oxcf).pass < AOM_RC_LAST_PASS)) {
      return 1;
    }
    iVar2 = encode_frame_to_data_rate
                      (in_stack_00000108,in_stack_00000100,in_stack_000000f8,in_stack_000000f0);
    if (iVar2 != 0) {
      return 1;
    }
  }
  else if ((in_RDI->oxcf).q_cfg.use_fixed_qp_offsets == 0) {
    av1_first_pass(in_stack_00000170,in_stack_00000168);
  }
  else {
    av1_noop_first_pass_frame(in_stack_00000060,in_stack_00000058);
  }
  return 0;
}

Assistant:

int av1_encode(AV1_COMP *const cpi, uint8_t *const dest, size_t dest_size,
               const EncodeFrameInput *const frame_input,
               const EncodeFrameParams *const frame_params,
               size_t *const frame_size) {
  AV1_COMMON *const cm = &cpi->common;
  CurrentFrame *const current_frame = &cm->current_frame;

  cpi->unscaled_source = frame_input->source;
  cpi->source = frame_input->source;
  cpi->unscaled_last_source = frame_input->last_source;

  current_frame->refresh_frame_flags = frame_params->refresh_frame_flags;
  cm->features.error_resilient_mode = frame_params->error_resilient_mode;
  cm->features.primary_ref_frame = frame_params->primary_ref_frame;
  cm->current_frame.frame_type = frame_params->frame_type;
  cm->show_frame = frame_params->show_frame;
  cpi->ref_frame_flags = frame_params->ref_frame_flags;
  cpi->speed = frame_params->speed;
  cm->show_existing_frame = frame_params->show_existing_frame;
  cpi->existing_fb_idx_to_show = frame_params->existing_fb_idx_to_show;

  memcpy(cm->remapped_ref_idx, frame_params->remapped_ref_idx,
         REF_FRAMES * sizeof(*cm->remapped_ref_idx));

  memcpy(&cpi->refresh_frame, &frame_params->refresh_frame,
         sizeof(cpi->refresh_frame));

  if (current_frame->frame_type == KEY_FRAME &&
      cpi->ppi->gf_group.refbuf_state[cpi->gf_frame_index] == REFBUF_RESET) {
    current_frame->frame_number = 0;
  }

  current_frame->order_hint =
      current_frame->frame_number + frame_params->order_offset;

  current_frame->display_order_hint = current_frame->order_hint;
  current_frame->order_hint %=
      (1 << (cm->seq_params->order_hint_info.order_hint_bits_minus_1 + 1));

  current_frame->pyramid_level = get_true_pyr_level(
      cpi->ppi->gf_group.layer_depth[cpi->gf_frame_index],
      current_frame->display_order_hint, cpi->ppi->gf_group.max_layer_depth);

  if (is_stat_generation_stage(cpi)) {
#if !CONFIG_REALTIME_ONLY
    if (cpi->oxcf.q_cfg.use_fixed_qp_offsets)
      av1_noop_first_pass_frame(cpi, frame_input->ts_duration);
    else
      av1_first_pass(cpi, frame_input->ts_duration);
#endif
  } else if (cpi->oxcf.pass == AOM_RC_ONE_PASS ||
             cpi->oxcf.pass >= AOM_RC_SECOND_PASS) {
    if (encode_frame_to_data_rate(cpi, frame_size, dest, dest_size) !=
        AOM_CODEC_OK) {
      return AOM_CODEC_ERROR;
    }
  } else {
    return AOM_CODEC_ERROR;
  }

  return AOM_CODEC_OK;
}